

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformation_t *
opengv::absolute_pose::epnp
          (transformation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  Indices idx;
  undefined1 local_20;
  vector<int,_std::allocator<int>_> *local_18;
  Indices *local_10;
  
  local_20 = 1;
  local_10 = (Indices *)
             ((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2);
  local_18 = indices;
  epnp(__return_storage_ptr__,(absolute_pose *)adapter,
       (AbsoluteAdapterBase *)&stack0xffffffffffffffe0,local_10);
  return __return_storage_ptr__;
}

Assistant:

opengv::transformation_t
opengv::absolute_pose::epnp(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return epnp(adapter,idx);
}